

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

bool proto2_unittest::Aggregate::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  uint32_t *puVar2;
  Aggregate *this_;
  MessageLite *msg_local;
  
  puVar2 = google::protobuf::internal::HasBits<1>::operator[]((HasBits<1> *)(msg + 1),0);
  if (((*puVar2 & 2) == 0) || (bVar1 = IsInitialized((Aggregate *)msg[2]._vptr_MessageLite), bVar1))
  {
    puVar2 = google::protobuf::internal::HasBits<1>::operator[]((HasBits<1> *)(msg + 1),0);
    if (((*puVar2 & 4) == 0) ||
       (bVar1 = google::protobuf::FileOptions::IsInitialized
                          ((FileOptions *)msg[2]._internal_metadata_.ptr_), bVar1)) {
      puVar2 = google::protobuf::internal::HasBits<1>::operator[]((HasBits<1> *)(msg + 1),0);
      if (((*puVar2 & 8) == 0) ||
         (bVar1 = AggregateMessageSet::IsInitialized
                            ((AggregateMessageSet *)msg[3]._vptr_MessageLite), bVar1)) {
        msg_local._7_1_ = true;
      }
      else {
        msg_local._7_1_ = false;
      }
    }
    else {
      msg_local._7_1_ = false;
    }
  }
  else {
    msg_local._7_1_ = false;
  }
  return msg_local._7_1_;
}

Assistant:

PROTOBUF_NOINLINE bool Aggregate::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const Aggregate&>(msg);
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._impl_.sub_->IsInitialized()) return false;
  }
  if ((this_._impl_._has_bits_[0] & 0x00000004u) != 0) {
    if (!this_._impl_.file_->IsInitialized()) return false;
  }
  if ((this_._impl_._has_bits_[0] & 0x00000008u) != 0) {
    if (!this_._impl_.mset_->IsInitialized()) return false;
  }
  return true;
}